

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<pickrst_test_lowbd::PixelProjErrorTest_DISABLED_Speed_Test>::CreateTest
          (ParameterizedTestFactory<pickrst_test_lowbd::PixelProjErrorTest_DISABLED_Speed_Test>
           *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<std::tuple<long_(*const)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_int_*,_int,_int_*,_int,_int_*,_const_sgr_params_type_*)>_>
  ::SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x48);
  pickrst_test_lowbd::PixelProjErrorTest_DISABLED_Speed_Test::PixelProjErrorTest_DISABLED_Speed_Test
            ((PixelProjErrorTest_DISABLED_Speed_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }